

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O0

XrResult GenValidUsageInputsXrPerfSettingsSetPerformanceLevelEXT
                   (XrSession session,XrPerfSettingsDomainEXT domain,XrPerfSettingsLevelEXT level)

{
  bool bVar1;
  ValidateXrHandleResult VVar2;
  GenValidUsageXrInstanceInfo *pGVar3;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> pVar4;
  string local_7d0 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_7b0;
  allocator local_791;
  string local_790 [39];
  allocator local_769;
  string local_768 [32];
  string local_748 [32];
  ostringstream local_728 [8];
  ostringstream oss_enum_1;
  allocator local_5a9;
  string local_5a8 [39];
  allocator local_581;
  string local_580 [39];
  allocator local_559;
  string local_558 [32];
  string local_538 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_518;
  allocator local_4f9;
  string local_4f8 [39];
  allocator local_4d1;
  string local_4d0 [32];
  string local_4b0 [32];
  ostringstream local_490 [8];
  ostringstream oss_enum;
  allocator local_311;
  string local_310 [39];
  allocator local_2e9;
  string local_2e8 [39];
  allocator local_2c1;
  string local_2c0 [32];
  GenValidUsageXrInstanceInfo *local_2a0;
  GenValidUsageXrInstanceInfo *gen_instance_info;
  GenValidUsageXrHandleInfo *gen_session_info;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> info_with_instance;
  string local_278 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_258;
  allocator local_239;
  string local_238 [39];
  allocator local_211;
  string local_210 [32];
  XrSession_T local_1f0 [32];
  ostringstream local_1d0 [8];
  ostringstream oss;
  ValidateXrHandleResult handle_result;
  XrObjectType local_44;
  undefined1 local_40 [8];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> objects_info;
  XrResult xr_result;
  XrPerfSettingsLevelEXT level_local;
  XrPerfSettingsDomainEXT domain_local;
  XrSession session_local;
  
  objects_info.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = XR_SUCCESS;
  _level_local = session;
  std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
            ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
             local_40);
  local_44 = XR_OBJECT_TYPE_SESSION;
  std::vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>>::
  emplace_back<XrSession_T*&,XrObjectType>
            ((vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>> *)local_40
             ,(XrSession_T **)&level_local,&local_44);
  VVar2 = VerifyXrSessionHandle((XrSession *)&level_local);
  if (VVar2 == VALIDATE_XR_HANDLE_SUCCESS) {
    pVar4 = HandleInfo<XrSession_T_*>::getWithInstanceInfo(&g_session_info,_level_local);
    pGVar3 = pVar4.second;
    gen_instance_info = (GenValidUsageXrInstanceInfo *)pVar4.first;
    local_2a0 = pGVar3;
    gen_session_info = (GenValidUsageXrHandleInfo *)gen_instance_info;
    info_with_instance.first = (GenValidUsageXrHandleInfo *)pGVar3;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2c0,"xrPerfSettingsSetPerformanceLevelEXT",&local_2c1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2e8,"xrPerfSettingsSetPerformanceLevelEXT",&local_2e9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_310,"domain",&local_311);
    bVar1 = ValidateXrEnum(pGVar3,(string *)local_2c0,(string *)local_2e8,(string *)local_310,
                           (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            *)local_40,domain);
    std::__cxx11::string::~string(local_310);
    std::allocator<char>::~allocator((allocator<char> *)&local_311);
    std::__cxx11::string::~string(local_2e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
    std::__cxx11::string::~string(local_2c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
    pGVar3 = local_2a0;
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_558,"xrPerfSettingsSetPerformanceLevelEXT",&local_559);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_580,"xrPerfSettingsSetPerformanceLevelEXT",&local_581);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_5a8,"level",&local_5a9);
      bVar1 = ValidateXrEnum(pGVar3,(string *)local_558,(string *)local_580,(string *)local_5a8,
                             (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                              *)local_40,level);
      std::__cxx11::string::~string(local_5a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_5a9);
      std::__cxx11::string::~string(local_580);
      std::allocator<char>::~allocator((allocator<char> *)&local_581);
      std::__cxx11::string::~string(local_558);
      std::allocator<char>::~allocator((allocator<char> *)&local_559);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        session_local._4_4_ =
             objects_info.
             super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
        info_with_instance.second._4_4_ = 1;
      }
      else {
        std::__cxx11::ostringstream::ostringstream(local_728);
        std::operator<<((ostream *)local_728,"Invalid XrPerfSettingsLevelEXT \"level\" enum value ")
        ;
        Uint32ToHexString_abi_cxx11_((uint32_t)local_748);
        std::operator<<((ostream *)local_728,local_748);
        std::__cxx11::string::~string(local_748);
        pGVar3 = local_2a0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_768,"VUID-xrPerfSettingsSetPerformanceLevelEXT-level-parameter",&local_769)
        ;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_790,"xrPerfSettingsSetPerformanceLevelEXT",&local_791);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  (&local_7b0,
                   (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                   local_40);
        std::__cxx11::ostringstream::str();
        CoreValidLogMessage(pGVar3,(string *)local_768,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                            (string *)local_790,&local_7b0,local_7d0);
        std::__cxx11::string::~string((string *)local_7d0);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                  (&local_7b0);
        std::__cxx11::string::~string(local_790);
        std::allocator<char>::~allocator((allocator<char> *)&local_791);
        std::__cxx11::string::~string(local_768);
        std::allocator<char>::~allocator((allocator<char> *)&local_769);
        session_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
        info_with_instance.second._4_4_ = 1;
        std::__cxx11::ostringstream::~ostringstream(local_728);
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream(local_490);
      std::operator<<((ostream *)local_490,"Invalid XrPerfSettingsDomainEXT \"domain\" enum value ")
      ;
      Uint32ToHexString_abi_cxx11_((uint32_t)local_4b0);
      std::operator<<((ostream *)local_490,local_4b0);
      std::__cxx11::string::~string(local_4b0);
      pGVar3 = local_2a0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_4d0,"VUID-xrPerfSettingsSetPerformanceLevelEXT-domain-parameter",&local_4d1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_4f8,"xrPerfSettingsSetPerformanceLevelEXT",&local_4f9);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_518,
                 (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 local_40);
      std::__cxx11::ostringstream::str();
      CoreValidLogMessage(pGVar3,(string *)local_4d0,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          (string *)local_4f8,&local_518,local_538);
      std::__cxx11::string::~string((string *)local_538);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                (&local_518);
      std::__cxx11::string::~string(local_4f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_4f9);
      std::__cxx11::string::~string(local_4d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_4d1);
      session_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
      info_with_instance.second._4_4_ = 1;
      std::__cxx11::ostringstream::~ostringstream(local_490);
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_1d0);
    std::operator<<((ostream *)local_1d0,"Invalid XrSession handle \"session\" ");
    HandleToHexString<XrSession_T*>(local_1f0);
    std::operator<<((ostream *)local_1d0,(string *)local_1f0);
    std::__cxx11::string::~string((string *)local_1f0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_210,"VUID-xrPerfSettingsSetPerformanceLevelEXT-session-parameter",&local_211);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_238,"xrPerfSettingsSetPerformanceLevelEXT",&local_239);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              (&local_258,
               (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               local_40);
    std::__cxx11::ostringstream::str();
    CoreValidLogMessage((GenValidUsageXrInstanceInfo *)0x0,(string *)local_210,
                        VALID_USAGE_DEBUG_SEVERITY_ERROR,(string *)local_238,&local_258,local_278);
    std::__cxx11::string::~string((string *)local_278);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
              (&local_258);
    std::__cxx11::string::~string(local_238);
    std::allocator<char>::~allocator((allocator<char> *)&local_239);
    std::__cxx11::string::~string(local_210);
    std::allocator<char>::~allocator((allocator<char> *)&local_211);
    session_local._4_4_ = XR_ERROR_HANDLE_INVALID;
    info_with_instance.second._4_4_ = 1;
    std::__cxx11::ostringstream::~ostringstream(local_1d0);
  }
  std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
            ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
             local_40);
  return session_local._4_4_;
}

Assistant:

XrResult GenValidUsageInputsXrPerfSettingsSetPerformanceLevelEXT(
XrSession session,
XrPerfSettingsDomainEXT domain,
XrPerfSettingsLevelEXT level) {
    try {
        XrResult xr_result = XR_SUCCESS;
        std::vector<GenValidUsageXrObjectInfo> objects_info;
        objects_info.emplace_back(session, XR_OBJECT_TYPE_SESSION);

        {
            // writeValidateInlineHandleValidation
            ValidateXrHandleResult handle_result = VerifyXrSessionHandle(&session);
            if (handle_result != VALIDATE_XR_HANDLE_SUCCESS) {
                // Not a valid handle or NULL (which is not valid in this case)
                std::ostringstream oss;
                oss << "Invalid XrSession handle \"session\" ";
                oss << HandleToHexString(session);
                CoreValidLogMessage(nullptr, "VUID-xrPerfSettingsSetPerformanceLevelEXT-session-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrPerfSettingsSetPerformanceLevelEXT",
                                    objects_info, oss.str());
                return XR_ERROR_HANDLE_INVALID;
            }
        }
        auto info_with_instance = g_session_info.getWithInstanceInfo(session);
        GenValidUsageXrHandleInfo *gen_session_info = info_with_instance.first;
        (void)gen_session_info;  // quiet warnings
        GenValidUsageXrInstanceInfo *gen_instance_info = info_with_instance.second;
        (void)gen_instance_info;  // quiet warnings
        // Make sure the enum type XrPerfSettingsDomainEXT value is valid
        if (!ValidateXrEnum(gen_instance_info, "xrPerfSettingsSetPerformanceLevelEXT", "xrPerfSettingsSetPerformanceLevelEXT", "domain", objects_info, domain)) {
            std::ostringstream oss_enum;
            oss_enum << "Invalid XrPerfSettingsDomainEXT \"domain\" enum value ";
            oss_enum << Uint32ToHexString(static_cast<uint32_t>(domain));
            CoreValidLogMessage(gen_instance_info, "VUID-xrPerfSettingsSetPerformanceLevelEXT-domain-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrPerfSettingsSetPerformanceLevelEXT",
                                objects_info, oss_enum.str());
            return XR_ERROR_VALIDATION_FAILURE;
        }
        // Make sure the enum type XrPerfSettingsLevelEXT value is valid
        if (!ValidateXrEnum(gen_instance_info, "xrPerfSettingsSetPerformanceLevelEXT", "xrPerfSettingsSetPerformanceLevelEXT", "level", objects_info, level)) {
            std::ostringstream oss_enum;
            oss_enum << "Invalid XrPerfSettingsLevelEXT \"level\" enum value ";
            oss_enum << Uint32ToHexString(static_cast<uint32_t>(level));
            CoreValidLogMessage(gen_instance_info, "VUID-xrPerfSettingsSetPerformanceLevelEXT-level-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrPerfSettingsSetPerformanceLevelEXT",
                                objects_info, oss_enum.str());
            return XR_ERROR_VALIDATION_FAILURE;
        }
        return xr_result;
    } catch (...) {
        return XR_ERROR_VALIDATION_FAILURE;
    }
}